

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  unique_ptr<cmake,_std::default_delete<cmake>_> *this_00;
  _Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_> _Var1;
  cmGlobalGenerator *pcVar2;
  int recursionDepth;
  cmake *pcVar3;
  cmGlobalGenerator *this_01;
  cmMakefile *pcVar4;
  cmCTestCommand *pcVar5;
  cmCTestStartCommand *this_02;
  pointer __p_1;
  pointer __p;
  string cwd;
  cmStateSnapshot snapshot;
  undefined1 local_118 [40];
  _Head_base<0UL,_cmCTestCommand_*,_false> local_f0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_e8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_e0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_d8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_d0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_c8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_c0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_b8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_b0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_a8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_a0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_98;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_90;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  cmStateSnapshot local_48;
  
  pcVar3 = (cmake *)operator_new(0x878);
  cmake::cmake(pcVar3,RoleScript,CTest,Normal);
  this_00 = &this->CMake;
  local_118._0_8_ = (__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>)0x0;
  std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
            ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)this_00,pcVar3);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr
            ((unique_ptr<cmake,_std::default_delete<cmake>_> *)local_118);
  pcVar3 = (this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl =
       (_Head_base<0UL,_cmake_*,_false>)((long)local_118 + 0x10);
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  cmake::SetHomeDirectory(pcVar3,(string *)local_118);
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  pcVar3 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  cmake::SetHomeOutputDirectory(pcVar3,(string *)local_118);
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  pcVar3 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_118._16_8_ = (pcVar3->CurrentSnapshot).Position.Position;
  local_118._0_8_ = (pcVar3->CurrentSnapshot).State;
  local_118._8_8_ = (pcVar3->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_118);
  cmake::AddCMakePaths
            ((this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl);
  pcVar3 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  this_01 = (cmGlobalGenerator *)operator_new(0x6f0);
  cmGlobalGenerator::cmGlobalGenerator(this_01,pcVar3);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = this_01;
  if (pcVar2 != (cmGlobalGenerator *)0x0) {
    (*pcVar2->_vptr_cmGlobalGenerator[1])();
  }
  pcVar3 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_48.Position.Position = (pcVar3->CurrentSnapshot).Position.Position;
  local_48.State = (pcVar3->CurrentSnapshot).State;
  local_48.Position.Tree = (pcVar3->CurrentSnapshot).Position.Tree;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_118,&local_48);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_118,&local_88);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_118,&local_48);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_118,&local_88);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  pcVar4 = (cmMakefile *)operator_new(0x7f8);
  cmMakefile::cmMakefile(pcVar4,pcVar2,&local_48);
  local_118._0_8_ = (__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>)0x0;
  std::__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>::reset
            ((__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> *)&this->Makefile,pcVar4
            );
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_118);
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    pcVar4 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(pcVar4,recursionDepth);
  }
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:245:5)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:245:5)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  cmake::SetProgressCallback
            ((this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_build","");
  pcVar5 = (cmCTestCommand *)operator_new(0x248);
  memset(pcVar5,0,0x248);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestBuildCommand_009ac180;
  pcVar5[9].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[9].super_cmCommand.Status;
  pcVar5[9].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[10].super_cmCommand.Makefile;
  pcVar5[10].CTest = (cmCTest *)(pcVar5 + 0xb);
  pcVar5[0xb].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0xb].CTestScriptHandler;
  pcVar5[0xc].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0xc].CTest;
  pcVar5[0xd].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xd].super_cmCommand.Status;
  pcVar5[0xd].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0xe].super_cmCommand.Makefile;
  local_b0._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_b0);
  if (local_b0._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_b0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_b0._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_configure","");
  pcVar5 = (cmCTestCommand *)operator_new(0x178);
  memset(pcVar5,0,0x178);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestConfigureCommand_009ac1f0;
  pcVar5[8].CTest = (cmCTest *)(pcVar5 + 9);
  local_b8._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_b8);
  if (local_b8._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_b8._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_b8._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_coverage","");
  pcVar5 = (cmCTestCommand *)operator_new(0x178);
  memset(pcVar5,0,0x178);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestCoverageCommand_009ac260;
  local_c0._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_c0);
  if (local_c0._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_c0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_c0._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"ctest_empty_binary_directory","");
  local_c8._M_head_impl = (cmCTestCommand *)operator_new(0x28);
  (local_c8._M_head_impl)->CTest = (cmCTest *)0x0;
  (local_c8._M_head_impl)->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  ((local_c8._M_head_impl)->super_cmCommand).Makefile = (cmMakefile *)0x0;
  ((local_c8._M_head_impl)->super_cmCommand).Status = (cmExecutionStatus *)0x0;
  ((local_c8._M_head_impl)->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_009ac2d0;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_c8);
  if (local_c8._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_c8._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_c8._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_memcheck","");
  pcVar5 = (cmCTestCommand *)operator_new(0x3a0);
  memset(pcVar5,0,0x3a0);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  pcVar5[8].CTest = (cmCTest *)(pcVar5 + 9);
  pcVar5[9].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[9].CTestScriptHandler;
  pcVar5[10].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[10].CTest;
  pcVar5[0xb].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xb].super_cmCommand.Status;
  pcVar5[0xb].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0xc].super_cmCommand.Makefile;
  pcVar5[0xc].CTest = (cmCTest *)(pcVar5 + 0xd);
  pcVar5[0xd].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0xd].CTestScriptHandler;
  pcVar5[0xe].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0xe].CTest;
  pcVar5[0xf].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xf].super_cmCommand.Status;
  pcVar5[0xf].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0x10].super_cmCommand.Makefile;
  pcVar5[0x10].CTest = (cmCTest *)(pcVar5 + 0x11);
  pcVar5[0x11].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0x11].CTestScriptHandler;
  pcVar5[0x12].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0x12].CTest;
  pcVar5[0x13].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0x13].super_cmCommand.Status;
  pcVar5[0x13].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0x14].super_cmCommand.Makefile;
  pcVar5[0x14].CTest = (cmCTest *)(pcVar5 + 0x15);
  pcVar5[0x15].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0x15].CTestScriptHandler;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestMemCheckCommand_009ac3e0;
  pcVar5[0x16].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0x16].CTestScriptHandler;
  local_d0._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_d0);
  if (local_d0._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_d0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_d0._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_read_custom_files","");
  local_d8._M_head_impl = (cmCTestCommand *)operator_new(0x28);
  (local_d8._M_head_impl)->CTest = (cmCTest *)0x0;
  (local_d8._M_head_impl)->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  ((local_d8._M_head_impl)->super_cmCommand).Makefile = (cmMakefile *)0x0;
  ((local_d8._M_head_impl)->super_cmCommand).Status = (cmExecutionStatus *)0x0;
  ((local_d8._M_head_impl)->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_009ac458;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_d8);
  if (local_d8._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_d8._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_d8._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_run_script","");
  local_e0._M_head_impl = (cmCTestCommand *)operator_new(0x28);
  (local_e0._M_head_impl)->CTest = (cmCTest *)0x0;
  (local_e0._M_head_impl)->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  ((local_e0._M_head_impl)->super_cmCommand).Makefile = (cmMakefile *)0x0;
  ((local_e0._M_head_impl)->super_cmCommand).Status = (cmExecutionStatus *)0x0;
  ((local_e0._M_head_impl)->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_009ac4a0;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_e0);
  if (local_e0._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_e0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_e0._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_sleep","");
  local_e8._M_head_impl = (cmCTestCommand *)operator_new(0x28);
  (local_e8._M_head_impl)->CTest = (cmCTest *)0x0;
  (local_e8._M_head_impl)->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  ((local_e8._M_head_impl)->super_cmCommand).Makefile = (cmMakefile *)0x0;
  ((local_e8._M_head_impl)->super_cmCommand).Status = (cmExecutionStatus *)0x0;
  ((local_e8._M_head_impl)->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_009ab020;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_e8);
  if (local_e8._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_e8._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_e8._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_start","");
  this_02 = (cmCTestStartCommand *)operator_new(0x30);
  cmCTestStartCommand::cmCTestStartCommand(this_02);
  local_f0._M_head_impl = (cmCTestCommand *)this_02;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_f0);
  if ((cmCTestStartCommand *)local_f0._M_head_impl != (cmCTestStartCommand *)0x0) {
    (*(((cmCTestCommand *)&(local_f0._M_head_impl)->super_cmCommand)->super_cmCommand).
      _vptr_cmCommand[1])();
  }
  local_f0._M_head_impl = (cmCTestCommand *)0x0;
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_submit","");
  pcVar5 = (cmCTestCommand *)operator_new(0x278);
  memset(pcVar5,0,0x278);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestSubmitCommand_009ab0c8;
  pcVar5[8].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[9].super_cmCommand.Makefile;
  pcVar5[9].CTest = (cmCTest *)(pcVar5 + 10);
  pcVar5[10].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[10].CTestScriptHandler;
  pcVar5[0xb].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0xb].CTest;
  pcVar5[0xc].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xc].super_cmCommand.Status;
  pcVar5[0xc].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0xd].super_cmCommand.Makefile;
  pcVar5[0xe].super_cmCommand.Status = (cmExecutionStatus *)0x0;
  pcVar5[0xe].CTest = (cmCTest *)0x0;
  pcVar5[0xe].CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  local_90._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_90);
  if (local_90._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_90._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_test","");
  pcVar5 = (cmCTestCommand *)operator_new(0x380);
  memset(pcVar5,0,0x380);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestTestCommand_009ab228;
  pcVar5[8].CTest = (cmCTest *)(pcVar5 + 9);
  pcVar5[9].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[9].CTestScriptHandler;
  pcVar5[10].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[10].CTest;
  pcVar5[0xb].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xb].super_cmCommand.Status;
  pcVar5[0xb].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0xc].super_cmCommand.Makefile;
  pcVar5[0xc].CTest = (cmCTest *)(pcVar5 + 0xd);
  pcVar5[0xd].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0xd].CTestScriptHandler;
  pcVar5[0xe].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0xe].CTest;
  pcVar5[0xf].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0xf].super_cmCommand.Status;
  pcVar5[0xf].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0x10].super_cmCommand.Makefile;
  pcVar5[0x10].CTest = (cmCTest *)(pcVar5 + 0x11);
  pcVar5[0x11].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0x11].CTestScriptHandler;
  pcVar5[0x12].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[0x12].CTest;
  pcVar5[0x13].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[0x13].super_cmCommand.Status;
  pcVar5[0x13].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[0x14].super_cmCommand.Makefile;
  pcVar5[0x14].CTest = (cmCTest *)(pcVar5 + 0x15);
  pcVar5[0x15].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[0x15].CTestScriptHandler;
  local_98._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_98);
  if (local_98._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_98._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_update","");
  pcVar5 = (cmCTestCommand *)operator_new(0x158);
  memset(pcVar5,0,0x158);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestHandlerCommand_009ab2a0;
  local_a0._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_a0);
  if (local_a0._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_a0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ctest_upload","");
  pcVar5 = (cmCTestCommand *)operator_new(0x170);
  memset(pcVar5,0,0x160);
  pcVar5[4].CTest = (cmCTest *)(pcVar5 + 5);
  pcVar5[5].super_cmCommand.Status = (cmExecutionStatus *)&pcVar5[5].CTestScriptHandler;
  pcVar5[6].super_cmCommand.Makefile = (cmMakefile *)&pcVar5[6].CTest;
  pcVar5[7].super_cmCommand._vptr_cmCommand = (_func_int **)&pcVar5[7].super_cmCommand.Status;
  pcVar5[7].CTestScriptHandler = (cmCTestScriptHandler *)&pcVar5[8].super_cmCommand.Makefile;
  (pcVar5->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCTestUploadCommand_009ab3d8;
  pcVar5[8].CTest = (cmCTest *)0x0;
  pcVar5[8].CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  pcVar5[9].super_cmCommand._vptr_cmCommand = (_func_int **)0x0;
  local_a8._M_head_impl = pcVar5;
  AddCTestCommand(this,(string *)local_118,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_a8);
  if (local_a8._M_head_impl != (cmCTestCommand *)0x0) {
    (*((local_a8._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  if ((_Head_base<0UL,_cmake_*,_false>)local_118._0_8_ !=
      _Var1.super__Head_base<0UL,_cmake_*,_false>._M_head_impl) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  this->CMake = cm::make_unique<cmake>(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator =
    cm::make_unique<cmGlobalGenerator>(this->CMake.get());

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile =
    cm::make_unique<cmMakefile>(this->GlobalGenerator.get(), snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", cm::make_unique<cmCTestBuildCommand>());
  this->AddCTestCommand("ctest_configure",
                        cm::make_unique<cmCTestConfigureCommand>());
  this->AddCTestCommand("ctest_coverage",
                        cm::make_unique<cmCTestCoverageCommand>());
  this->AddCTestCommand("ctest_empty_binary_directory",
                        cm::make_unique<cmCTestEmptyBinaryDirectoryCommand>());
  this->AddCTestCommand("ctest_memcheck",
                        cm::make_unique<cmCTestMemCheckCommand>());
  this->AddCTestCommand("ctest_read_custom_files",
                        cm::make_unique<cmCTestReadCustomFilesCommand>());
  this->AddCTestCommand("ctest_run_script",
                        cm::make_unique<cmCTestRunScriptCommand>());
  this->AddCTestCommand("ctest_sleep", cm::make_unique<cmCTestSleepCommand>());
  this->AddCTestCommand("ctest_start", cm::make_unique<cmCTestStartCommand>());
  this->AddCTestCommand("ctest_submit",
                        cm::make_unique<cmCTestSubmitCommand>());
  this->AddCTestCommand("ctest_test", cm::make_unique<cmCTestTestCommand>());
  this->AddCTestCommand("ctest_update",
                        cm::make_unique<cmCTestUpdateCommand>());
  this->AddCTestCommand("ctest_upload",
                        cm::make_unique<cmCTestUploadCommand>());
}